

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_av1d_vdpu.c
# Opt level: O0

MPP_RET vdpu_av1d_gen_regs(void *hal,HalTaskInfo *task)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  long lVar24;
  long lVar25;
  uint uVar26;
  anon_struct_4_2_133d7162_for_swreg498 aVar27;
  RK_U32 RVar28;
  RK_U32 RVar29;
  MppFrameFormat MVar30;
  uint uVar31;
  int iVar32;
  UINT32 UVar33;
  HalBuf *pHVar34;
  size_t sVar35;
  uint uVar36;
  uint uVar37;
  bool bVar38;
  uint local_e4;
  uint local_e0;
  uint local_d8;
  uint local_d4;
  uint local_d0;
  bool local_c9;
  int local_c4;
  RK_U32 out_fmt;
  RK_U32 y_stride_1;
  RK_U32 out_h;
  RK_U32 out_w;
  RK_U32 bypass_filter;
  RK_U32 vir_bottom;
  RK_U32 vir_top;
  RK_U32 vir_right;
  RK_U32 vir_left;
  RK_U32 offset;
  RK_U32 mv_offset;
  RK_U32 uv_stride;
  RK_U32 y_stride;
  RK_U32 i;
  RK_U32 num_tile_cols;
  HalBuf *tile_out_buf;
  RK_U32 ver_stride;
  RK_U32 hor_stride;
  RK_U32 width;
  RK_U32 height;
  MppBuffer streambuf;
  MppBuffer buffer;
  MppFrame mframe;
  DXVA_PicParams_AV1 *dxva;
  VdpuAv1dRegSet *regs;
  VdpuAv1dRegCtx *ctx;
  Av1dHalCtx *p_hal;
  HalTaskInfo *pHStack_30;
  MPP_RET ret;
  HalTaskInfo *task_local;
  void *hal_local;
  
  p_hal._4_4_ = MPP_ERR_UNKNOW;
  regs = *(VdpuAv1dRegSet **)((long)hal + 0x50);
  mframe = (task->dec).syntax.data;
  streambuf = (MppBuffer)0x0;
  _width = (MppBuffer)0x0;
  uVar1 = *(ushort *)((long)mframe + 4);
  uVar26 = (uint)uVar1;
  uVar2 = *(ushort *)((long)mframe + 2);
  uVar37 = (uint)uVar2;
  aVar27 = (anon_struct_4_2_133d7162_for_swreg498)(1 << (*(byte *)((long)mframe + 0xc98) & 0x1f));
  ctx = (VdpuAv1dRegCtx *)hal;
  pHStack_30 = task;
  task_local = (HalTaskInfo *)hal;
  if (hal == (void *)0x0) {
    p_hal._4_4_ = 0xfffffc16;
    if ((hal_av1d_debug & 4) != 0) {
      _mpp_log_l(4,"hal_av1d_vdpu","input empty(%d).\n",(char *)0x0,0x74e);
    }
  }
  else {
    regs[0x36].reserved_267_297[0xe] = (uint)*(byte *)((long)mframe + 0xc86);
    if ((((task->dec).flags.val >> 2 & 1) == 0) && (((task->dec).flags.val >> 3 & 1) == 0)) {
      if (*(int *)((long)hal + 0x58) != 0) {
        for (uv_stride = 0; uv_stride < 3; uv_stride = uv_stride + 1) {
          if ((&regs->swreg0)[(ulong)uv_stride * 4] == (anon_struct_4_5_4294a32a_for_swreg0)0x0) {
            (task->dec).reg_index = uv_stride;
            *(undefined8 *)&regs[0x3c].vdpu_av1d_pp_cfg.swreg490 =
                 *(undefined8 *)(&regs->swreg2 + (ulong)uv_stride * 4);
            (&regs->swreg0)[(ulong)uv_stride * 4] = (anon_struct_4_5_4294a32a_for_swreg0)0x1;
            break;
          }
        }
      }
      dxva = *(DXVA_PicParams_AV1 **)&regs[0x3c].vdpu_av1d_pp_cfg.swreg490;
      memset(dxva,0,0x800);
      vdpu_av1d_setup_tile_bufs(ctx,(DXVA_PicParams_AV1 *)mframe);
      lVar24._0_4_ = regs->swreg22;
      lVar24._4_4_ = regs->swreg23;
      if (((lVar24 == 0) || (regs[0x36].reserved_267_297[0x10] < uVar26)) ||
         ((uint)regs[0x3c].vdpu_av1d_pp_cfg.swreg498 < (uint)aVar27)) {
        lVar25._0_4_ = regs->swreg22;
        lVar25._4_4_ = regs->swreg23;
        if (lVar25 != 0) {
          vdpu_av1d_filtermem_release((VdpuAv1dRegCtx *)regs);
        }
        p_hal._4_4_ = vdpu_av1d_filtermem_alloc
                                ((Av1dHalCtx *)ctx,(VdpuAv1dRegCtx *)regs,
                                 (DXVA_PicParams_AV1 *)mframe);
        if (p_hal._4_4_ == MPP_OK) {
          _mpp_log_l(2,"hal_av1d_vdpu","filt buffer get fail\n",(char *)0x0);
          vdpu_av1d_filtermem_release((VdpuAv1dRegCtx *)regs);
        }
      }
      regs[0x36].reserved_267_297[0xf] = uVar37;
      regs[0x36].reserved_267_297[0x10] = uVar26;
      regs[0x3c].vdpu_av1d_pp_cfg.swreg498 = aVar27;
      mpp_buf_slot_get_prop
                (*(MppBufSlots *)(ctx->reg_buf + 2),(pHStack_30->dec).output,SLOT_FRAME_PTR,&buffer)
      ;
      mpp_buf_slot_get_prop
                (*(MppBufSlots *)(ctx->reg_buf + 2),(pHStack_30->dec).output,SLOT_BUFFER,&streambuf)
      ;
      mpp_buf_slot_get_prop(ctx->reg_buf[2].regs,(pHStack_30->dec).input,SLOT_BUFFER,&width);
      pHVar34 = hal_bufs_get_buf(*(HalBufs *)&regs[0x3c].vdpu_av1d_pp_cfg.swreg492,
                                 (pHStack_30->dec).output);
      RVar28 = mpp_frame_get_hor_stride(buffer);
      RVar29 = mpp_frame_get_ver_stride(buffer);
      regs[0x36].reserved_267_297[0x12] = RVar29;
      sVar35 = mpp_packet_get_length((pHStack_30->dec).input_packet);
      ctx->reg_buf[1].valid = (RK_U32)sVar35;
      MVar30 = mpp_frame_get_fmt(buffer);
      regs[0x3c].vdpu_av1d_pp_cfg.swreg480.field_0x1 = (MVar30 & 0xf00000) != MPP_FMT_YUV420SP;
      if ((hal_av1d_debug & 8) != 0) {
        uVar3 = *(ushort *)((long)mframe + 0xe);
        MVar30 = mpp_frame_get_fmt(buffer);
        _mpp_log_l(4,"hal_av1d_vdpu","bitdepth %d fmt %d [%d : %d] wxh [%d : %d] uxv [%d : %d]\n",
                   (char *)0x0,(ulong)uVar3,(ulong)MVar30,(uint)*(byte *)((long)mframe + 0x52b),
                   (uint)*(byte *)((long)mframe + 0x52c),regs[0x36].reserved_267_297[0xf],
                   regs[0x36].reserved_267_297[0x10],regs[0x36].reserved_267_297[0x11],
                   regs[0x36].reserved_267_297[0x12]);
      }
      uVar36._0_2_ = dxva->height;
      uVar36._2_2_ = dxva->max_width;
      dxva->height = (short)(uVar36 & 0xffffffdf);
      dxva->max_width = (short)((uVar36 & 0xffffffdf) >> 0x10);
      uVar31._0_2_ = dxva->height;
      uVar31._2_2_ = dxva->max_width;
      uVar36 = uVar31 & 0xfffffffe | 1;
      dxva->height = (short)uVar36;
      dxva->max_width = (short)(uVar36 >> 0x10);
      uVar4._0_2_ = dxva->height;
      uVar4._2_2_ = dxva->max_width;
      dxva->height = (short)(uVar4 & 0xffffff7f);
      dxva->max_width = (short)((uVar4 & 0xffffff7f) >> 0x10);
      uVar5._0_2_ = dxva->max_height;
      uVar5._2_2_ = dxva->CurrPicTextureIndex;
      uVar36 = uVar5 & 0xfffffbff | 0x400;
      dxva->max_height = (short)uVar36;
      dxva->CurrPicTextureIndex = (short)(uVar36 >> 0x10);
      uVar6._0_2_ = dxva->superres_denom;
      uVar6._2_2_ = dxva->bitdepth;
      uVar36 = uVar6 & 0x7ffffff | 0x88000000;
      dxva->superres_denom = (short)uVar36;
      dxva->bitdepth = (short)(uVar36 >> 0x10);
      uVar7._0_2_ = dxva->superres_denom;
      uVar7._2_2_ = dxva->bitdepth;
      uVar36 = uVar7 & 0xfbffffff |
               ((uint)((ulong)*(undefined8 *)((long)mframe + 0x14) >> 0x20) & 1) << 0x1a;
      dxva->superres_denom = (short)uVar36;
      dxva->bitdepth = (short)(uVar36 >> 0x10);
      uVar8._0_2_ = dxva->superres_denom;
      uVar8._2_2_ = dxva->bitdepth;
      dxva->superres_denom = (short)(uVar8 & 0xfffeffff);
      dxva->bitdepth = (short)((uVar8 & 0xfffeffff) >> 0x10);
      uVar9._0_2_ = dxva->superres_denom;
      uVar9._2_2_ = dxva->bitdepth;
      uVar36 = uVar9 & 0xffffefff | 0x1000;
      dxva->superres_denom = (short)uVar36;
      dxva->bitdepth = (short)(uVar36 >> 0x10);
      uVar10._0_2_ = dxva->superres_denom;
      uVar10._2_2_ = dxva->bitdepth;
      uVar36 = uVar10 & 0xfffffeff | 0x100;
      dxva->superres_denom = (short)uVar36;
      dxva->bitdepth = (short)(uVar36 >> 0x10);
      *(uint *)&dxva->field_10 =
           *(uint *)&dxva->field_10 & 0xfffff7ff |
           ((uint)((ulong)*(undefined8 *)((long)mframe + 0x14) >> 0x26) & 1) << 0xb;
      *(uint *)&dxva->field_10 =
           *(uint *)&dxva->field_10 & 0xfe7fffff | (*(byte *)((long)mframe + 0x53b) & 3) << 0x17;
      *(uint *)&dxva->field_10 =
           *(uint *)&dxva->field_10 & 0xffbfffff | (*(byte *)((long)mframe + 0x539) & 1) << 0x16;
      *(uint *)&dxva->field_10 =
           *(uint *)&dxva->field_10 & 0xffdfffff | (*(byte *)((long)mframe + 0x53a) & 1) << 0x15;
      *(uint *)&dxva->field_10 =
           *(uint *)&dxva->field_10 & 0xfff7ffff |
           ((uint)(*(ulong *)((long)mframe + 0x14) >> 0x1e) & 1) << 0x13;
      *(uint *)&dxva->field_10 =
           *(uint *)&dxva->field_10 & 0xfffbffff |
           ((uint)((ulong)*(undefined8 *)((long)mframe + 0x14) >> 0x10) & 1) << 0x12;
      *(uint *)&dxva->field_10 =
           *(uint *)&dxva->field_10 & 0xfffeffff | (*(byte *)((long)mframe + 0x529) & 1) << 0x10;
      *(uint *)&dxva->field_10 =
           *(uint *)&dxva->field_10 & 0xffff7fff |
           ((uint)(*(ulong *)((long)mframe + 0x14) >> 0x1b) & 1) << 0xf;
      local_c9 = false;
      if (((*(char *)((long)mframe + 0x559) == '\0') &&
          (local_c9 = false, *(char *)((long)mframe + 0x558) == '\0')) &&
         ((local_c9 = false, *(char *)((long)mframe + 0x55a) == '\0' &&
          ((local_c9 = false, *(char *)((long)mframe + 0x55b) == '\0' &&
           (local_c9 = false, *(char *)((long)mframe + 0x56a) == '\0')))))) {
        local_c9 = *(char *)((long)mframe + 0x56b) == '\0';
      }
      *(uint *)&dxva->field_10 =
           *(uint *)&dxva->field_10 & 0xffffbfff | (uint)((local_c9 ^ 0xffU) & 1) << 0xe;
      *(uint *)&dxva->field_10 =
           *(uint *)&dxva->field_10 & 0xffffdfff |
           ((uint)(*(ulong *)((long)mframe + 0x14) >> 0xf) & 1) << 0xd;
      *(uint *)&dxva->field_10 =
           *(uint *)&dxva->field_10 & 0xffffefff |
           ((uint)(*(ulong *)((long)mframe + 0x14) >> 0xe) & 1) << 0xc;
      *(uint *)&dxva->field_10 =
           *(uint *)&dxva->field_10 & 0xfffffbff |
           ((uint)(*(ulong *)((long)mframe + 0x14) >> 0xd) & 1) << 10;
      *(uint *)&dxva->field_10 =
           *(uint *)&dxva->field_10 & 0xfffffdff |
           ((uint)(*(ulong *)((long)mframe + 0x14) >> 0x1c) & 1) << 9;
      *(uint *)&dxva->field_10 =
           *(uint *)&dxva->field_10 & 0xfffffeff |
           ((uint)(*(ulong *)((long)mframe + 0x14) >> 0x12) & 1) << 8;
      *(uint *)&dxva->field_10 =
           *(uint *)&dxva->field_10 & 0xffffff7f |
           ((uint)(*(ulong *)((long)mframe + 0x14) >> 0x11) & 1) << 7;
      *(uint *)&dxva->field_10 =
           *(uint *)&dxva->field_10 & 0xffffffbf |
           ((uint)((ulong)*(undefined8 *)((long)mframe + 0x14) >> 0x21) & 1) << 6;
      *(uint *)&dxva->field_10 =
           *(uint *)&dxva->field_10 & 0xffffffdf |
           ((uint)(*(ulong *)((long)mframe + 0x14) >> 0x13) & 1) << 5;
      *(uint *)&dxva->field_10 =
           *(uint *)&dxva->field_10 & 0xffffffef |
           ((uint)(*(ulong *)((long)mframe + 0x14) >> 0x19) & 1) << 4;
      *(uint *)&dxva->field_10 =
           *(uint *)&dxva->field_10 & 0xfffffff7 |
           ((uint)(*(ulong *)((long)mframe + 0x14) >> 0x14) & 1) << 3;
      vdpu_av1d_set_global_model((Av1dHalCtx *)ctx,(DXVA_PicParams_AV1 *)mframe);
      vdpu_av1d_set_tile_info_mem((Av1dHalCtx *)ctx,(DXVA_PicParams_AV1 *)mframe);
      if (((*(char *)((long)mframe + 0x528) != '\0') && (*(char *)((long)mframe + 0x528) != '\x02'))
         || ((*(ulong *)((long)mframe + 0x14) >> 0x19 & 1) != 0)) {
        vdpu_av1d_set_reference_frames
                  ((Av1dHalCtx *)ctx,(VdpuAv1dRegCtx *)regs,(DXVA_PicParams_AV1 *)mframe);
      }
      vdpu_av1d_set_segmentation((VdpuAv1dRegCtx *)regs,(DXVA_PicParams_AV1 *)mframe);
      vdpu_av1d_set_loopfilter((Av1dHalCtx *)ctx,(DXVA_PicParams_AV1 *)mframe);
      vdpu_av1d_set_picture_dimensions((Av1dHalCtx *)ctx,(DXVA_PicParams_AV1 *)mframe);
      vdpu_av1d_set_cdef((Av1dHalCtx *)ctx,(DXVA_PicParams_AV1 *)mframe);
      vdpu_av1d_set_lr((Av1dHalCtx *)ctx,(DXVA_PicParams_AV1 *)mframe);
      vdpu_av1d_set_fgs((VdpuAv1dRegCtx *)regs,(DXVA_PicParams_AV1 *)mframe);
      vdpu_av1d_set_prob((Av1dHalCtx *)ctx,(DXVA_PicParams_AV1 *)mframe);
      vdpu_av1d_set_tile_info_regs((VdpuAv1dRegCtx *)regs,(DXVA_PicParams_AV1 *)mframe);
      uVar11._0_2_ = (dxva->tiles).cols;
      uVar11._2_2_ = (dxva->tiles).rows;
      uVar36 = uVar11 & 0xbfffffff | (*(byte *)((long)mframe + 0x52d) & 1) << 0x1e;
      (dxva->tiles).cols = (short)uVar36;
      (dxva->tiles).rows = (short)(uVar36 >> 0x10);
      uVar12._0_2_ = (dxva->tiles).cols;
      uVar12._2_2_ = (dxva->tiles).rows;
      uVar36 = uVar12 & 0xffffefff | (*(byte *)((long)mframe + 0x693) & 1) << 0xc;
      (dxva->tiles).cols = (short)uVar36;
      (dxva->tiles).rows = (short)(uVar36 >> 0x10);
      uVar13._0_2_ = (dxva->tiles).cols;
      uVar13._2_2_ = (dxva->tiles).rows;
      uVar36 = uVar13 & 0xfffffff9 | (*(byte *)((long)mframe + 0x54d) & 3) << 1;
      (dxva->tiles).cols = (short)uVar36;
      (dxva->tiles).rows = (short)(uVar36 >> 0x10);
      uVar14._0_2_ = (dxva->tiles).cols;
      uVar14._2_2_ = (dxva->tiles).rows;
      uVar36 = uVar14 & 0xfffffffe | *(byte *)((long)mframe + 0x54c) & 1;
      (dxva->tiles).cols = (short)uVar36;
      (dxva->tiles).rows = (short)(uVar36 >> 0x10);
      uVar15._0_2_ = (dxva->tiles).context_update_id;
      uVar15._2_2_ = (dxva->tiles).widths[0];
      uVar36 = uVar15 & 0xfffeffff | (uint)(*(char *)((long)mframe + 0x528) == '\0') << 0x10;
      (dxva->tiles).context_update_id = (short)uVar36;
      (dxva->tiles).widths[0] = (short)(uVar36 >> 0x10);
      uVar16._0_2_ = (dxva->tiles).context_update_id;
      uVar16._2_2_ = (dxva->tiles).widths[0];
      uVar36 = uVar16 & 0xffff00ff | (uint)*(byte *)((long)mframe + 0x54e) << 8;
      (dxva->tiles).context_update_id = (short)uVar36;
      (dxva->tiles).widths[0] = (short)(uVar36 >> 0x10);
      uVar17._0_2_ = (dxva->tiles).context_update_id;
      uVar17._2_2_ = (dxva->tiles).widths[0];
      uVar36 = uVar17 & 0xffffff3f | (*(ushort *)((long)mframe + 0xe) - 8 & 3) << 6;
      (dxva->tiles).context_update_id = (short)uVar36;
      (dxva->tiles).widths[0] = (short)(uVar36 >> 0x10);
      uVar18._0_2_ = (dxva->tiles).context_update_id;
      uVar18._2_2_ = (dxva->tiles).widths[0];
      uVar36 = uVar18 & 0xffffffcf | (*(ushort *)((long)mframe + 0xe) - 8 & 3) << 4;
      (dxva->tiles).context_update_id = (short)uVar36;
      (dxva->tiles).widths[0] = (short)(uVar36 >> 0x10);
      *(uint *)((dxva->tiles).widths + 5) =
           *(uint *)((dxva->tiles).widths + 5) & 0xfffff8ff |
           (*(byte *)((long)mframe + 0xc64) & 7) << 8;
      *(uint *)((dxva->tiles).widths + 5) =
           *(uint *)((dxva->tiles).widths + 5) & 0xffffff7f |
           ((uint)(*(ulong *)((long)mframe + 0x14) >> 0x1a) & 1) << 7;
      iVar32 = 0;
      if ((*(ulong *)((long)mframe + 0x14) >> 0x1f & 1) != 0) {
        iVar32 = 2;
      }
      *(uint *)((dxva->tiles).widths + 5) =
           *(uint *)((dxva->tiles).widths + 5) & 0xffffffcf | iVar32 << 4;
      if (((uint)((ulong)*(undefined8 *)((long)mframe + 0x14) >> 0x23) & 7) == 0) {
        local_d0 = 0;
      }
      else {
        local_d0 = ((uint)((ulong)*(undefined8 *)((long)mframe + 0x14) >> 0x23) & 7) + 2;
      }
      *(uint *)((dxva->tiles).widths + 5) =
           *(uint *)((dxva->tiles).widths + 5) & 0xc7ffffff | (local_d0 & 7) << 0x1b;
      iVar32 = 6;
      if ((*(ulong *)((long)mframe + 0x14) >> 0xc & 1) != 0) {
        iVar32 = 7;
      }
      *(uint *)((dxva->tiles).widths + 7) =
           *(uint *)((dxva->tiles).widths + 7) & 0xffffe3ff | iVar32 << 10;
      *(uint *)((dxva->tiles).widths + 7) =
           *(uint *)((dxva->tiles).widths + 7) & 0xffff1fff | 0x6000;
      *(uint *)((dxva->tiles).widths + 7) = *(uint *)((dxva->tiles).widths + 7) & 0xfff8ffff;
      *(uint *)((dxva->tiles).widths + 9) = *(uint *)((dxva->tiles).widths + 9) & 0xffffffc7;
      *(uint *)((dxva->tiles).widths + 9) = *(uint *)((dxva->tiles).widths + 9) & 0xfffffe3f;
      *(uint *)((dxva->tiles).widths + 0xb) = *(uint *)((dxva->tiles).widths + 0xb) & 0xffffc0ff;
      *(uint *)((dxva->tiles).widths + 0xd) = *(uint *)((dxva->tiles).widths + 0xd) & 0xffffc0ff;
      *(uint *)((dxva->tiles).widths + 0xf) = *(uint *)((dxva->tiles).widths + 0xf) & 0xffffc0ff;
      *(uint *)((dxva->tiles).widths + 0x11) = *(uint *)((dxva->tiles).widths + 0x11) & 0xffffc0ff;
      *(uint *)((dxva->tiles).widths + 0x13) = *(uint *)((dxva->tiles).widths + 0x13) & 0xffffc0ff;
      *(uint *)((dxva->tiles).widths + 0x15) = *(uint *)((dxva->tiles).widths + 0x15) & 0xffffc0ff;
      *(uint *)((dxva->tiles).widths + 0x2d) = *(uint *)((dxva->tiles).widths + 0x2d) & 0xffffc0ff;
      *(uint *)((dxva->tiles).widths + 0x2f) = *(uint *)((dxva->tiles).widths + 0x2f) & 0xffffc0ff;
      *(uint *)((dxva->tiles).widths + 9) =
           *(uint *)((dxva->tiles).widths + 9) & 0x1ffffff |
           (int)*(char *)((long)mframe + 0x54f) << 0x19;
      *(uint *)((dxva->tiles).widths + 9) =
           *(uint *)((dxva->tiles).widths + 9) & 0xfe03ffff |
           ((int)*(char *)((long)mframe + 0x550) & 0x7fU) << 0x12;
      *(uint *)((dxva->tiles).widths + 9) =
           *(uint *)((dxva->tiles).widths + 9) & 0xfffc07ff |
           ((int)*(char *)((long)mframe + 0x552) & 0x7fU) << 0xb;
      *(uint *)((dxva->tiles).heights + 0xd) =
           *(uint *)((dxva->tiles).heights + 0xd) & 0x87ffffff |
           (*(byte *)((long)mframe + 0x555) & 0xf) << 0x1b;
      *(uint *)((dxva->tiles).heights + 0xf) =
           *(uint *)((dxva->tiles).heights + 0xf) & 0x87ffffff |
           (*(byte *)((long)mframe + 0x556) & 0xf) << 0x1b;
      *(uint *)((dxva->tiles).heights + 0x11) =
           *(uint *)((dxva->tiles).heights + 0x11) & 0xfffc3fff |
           (*(byte *)((long)mframe + 0x557) & 0xf) << 0xe;
      *(uint *)((dxva->tiles).widths + 9) =
           *(uint *)((dxva->tiles).widths + 9) & 0xfffffdff |
           (*(byte *)((long)mframe + 0xc5c) & 1) << 9;
      *(uint *)((dxva->tiles).widths + 0x27) =
           *(uint *)((dxva->tiles).widths + 0x27) & 0x1ffffff |
           (int)*(char *)((long)mframe + 0x551) << 0x19;
      *(uint *)((dxva->tiles).widths + 0x29) =
           *(uint *)((dxva->tiles).widths + 0x29) & 0x1ffffff |
           (int)*(char *)((long)mframe + 0x553) << 0x19;
      if (*(char *)((long)mframe + 0xc84) == '\0') {
        local_d4 = 1;
      }
      else {
        local_d4 = (uint)*(byte *)((long)mframe + 0xc84);
      }
      *(uint *)((dxva->tiles).widths + 0x2d) =
           *(uint *)((dxva->tiles).widths + 0x2d) & 0xc3ffffff | (local_d4 & 0xf) << 0x1a;
      if (*(char *)((long)mframe + 0xc85) == '\0') {
        local_d8 = 1;
      }
      else {
        local_d8 = (uint)*(byte *)((long)mframe + 0xc85);
      }
      *(uint *)((dxva->tiles).widths + 0x2f) =
           *(uint *)((dxva->tiles).widths + 0x2f) & 0xc3ffffff | (local_d8 & 0xf) << 0x1a;
      uVar36 = regs[0x36].reserved_267_297[0x13];
      uVar31 = *(uint *)((long)mframe + 0xc7c) & 0xfffffff0;
      iVar32 = mpp_buffer_get_fd_with_caller(*pHVar34->buf,"vdpu_av1d_gen_regs");
      *(int *)((dxva->tiles).heights + 0x31) = iVar32;
      UVar33 = mpp_buffer_get_fd_with_caller(*pHVar34->buf,"vdpu_av1d_gen_regs");
      (dxva->tiles).tile_offset_start[0x1a] = UVar33;
      mpp_dev_set_reg_offset(ctx->film_grain_mem,99,uVar36);
      UVar33 = mpp_buffer_get_fd_with_caller(*pHVar34->buf,"vdpu_av1d_gen_regs");
      (dxva->tiles).tile_offset_start[0x3c] = UVar33;
      mpp_dev_set_reg_offset(ctx->film_grain_mem,0x85,uVar36 + (uVar36 >> 1) + 0x40);
      (dxva->tiles).tile_offset_end[0x39] = ctx->reg_buf[1].valid + 0x7f & 0xffffff80;
      *(uint *)&dxva->field_10 =
           *(uint *)&dxva->field_10 & 0x1ffffff | *(int *)((long)mframe + 0xc7c) << 0x1c;
      *(RK_U32 *)((long)&dxva->field_10 + 4) = ctx->reg_buf[1].valid + 0x7f & 0xffffff80;
      (dxva->tiles).tile_offset_end[0x3a] = 0;
      (dxva->tiles).tile_offset_start[0x5f] = 0;
      UVar33 = mpp_buffer_get_fd_with_caller(_width,"vdpu_av1d_gen_regs");
      (dxva->tiles).tile_offset_start[0x60] = UVar33;
      mpp_dev_set_reg_offset(ctx->film_grain_mem,0xa9,uVar31);
      if ((hal_av1d_debug & 8) != 0) {
        _mpp_log_l(4,"hal_av1d_vdpu","stream len %d\n",(char *)0x0,(ulong)ctx->reg_buf[1].valid);
      }
      if ((hal_av1d_debug & 8) != 0) {
        _mpp_log_l(4,"hal_av1d_vdpu","stream offset %d\n",(char *)0x0,(ulong)uVar31);
      }
      if ((hal_av1d_debug & 8) != 0) {
        _mpp_log_l(4,"hal_av1d_vdpu","stream tag_size %d\n",(char *)0x0,
                   (ulong)*(uint *)((long)mframe + 0xc7c));
      }
      if ((hal_av1d_debug & 8) != 0) {
        _mpp_log_l(4,"hal_av1d_vdpu","stream start_bit %d\n",(char *)0x0,
                   (ulong)(*(uint *)&dxva->field_10 >> 0x19));
      }
      (dxva->tiles).tile_offset_end[0x71] = (dxva->tiles).tile_offset_end[0x71] & 0xffff0000 | 0x40;
      UVar33 = mpp_buffer_get_fd_with_caller(*(MppBuffer *)&regs->swreg24,"vdpu_av1d_gen_regs");
      (dxva->tiles).tile_offset_start[0x66] = UVar33;
      UVar33 = mpp_buffer_get_fd_with_caller(*(MppBuffer *)&regs->swreg24,"vdpu_av1d_gen_regs");
      (dxva->tiles).tile_offset_start[0x68] = UVar33;
      *(uint *)((dxva->tiles).heights + 0x1d) = *(uint *)((dxva->tiles).heights + 0x1d) & 0x7fffffff
      ;
      *(uint *)((dxva->tiles).heights + 0x1d) =
           *(uint *)((dxva->tiles).heights + 0x1d) & 0xffff0000 | 8;
      *(uint *)((dxva->tiles).heights + 0x23) =
           *(uint *)((dxva->tiles).heights + 0x23) & 0xfffff8ff | 0x200;
      *(uint *)((dxva->tiles).heights + 0x23) =
           *(uint *)((dxva->tiles).heights + 0x23) & 0xffffff00 | 0x10;
      (dxva->tiles).tile_offset_end[0x41] = (dxva->tiles).tile_offset_end[0x41] & 0xbfffffff;
      (dxva->tiles).tile_offset_end[0x40] =
           (dxva->tiles).tile_offset_end[0x40] & 0xf003ffff | 0x1000000;
      (dxva->tiles).tile_offset_end[0x40] =
           (dxva->tiles).tile_offset_end[0x40] & 0xfffc00ff | 0x4000;
      (dxva->tiles).tile_offset_end[0x75] =
           (dxva->tiles).tile_offset_end[0x75] & 0x80000000 | 0xfffffff;
      (dxva->tiles).tile_offset_end[0x75] =
           (dxva->tiles).tile_offset_end[0x75] & 0x7fffffff | 0x80000000;
      (dxva->tiles).tile_offset_end[0x76] =
           (dxva->tiles).tile_offset_end[0x76] & 0x80000000 | 0xfffffff;
      (dxva->tiles).tile_offset_end[0x76] =
           (dxva->tiles).tile_offset_end[0x76] & 0x7fffffff | 0x80000000;
      (dxva->tiles).tile_offset_end[0x77] = (dxva->tiles).tile_offset_end[0x77] & 0xfffffffe | 1;
      (dxva->tiles).tile_offset_end[0x79] = (dxva->tiles).tile_offset_end[0x79] & 0x7ffffff;
      (dxva->segmentation).feature_data[5][0] =
           (dxva->segmentation).feature_data[5][0] & 0xffffffU | 0x1000000;
      (dxva->segmentation).feature_data[5][0] =
           (dxva->segmentation).feature_data[5][0] & 0xff00ffffU | 0x10000;
      *(uint *)&(dxva->format).subsampling_y =
           *(uint *)&(dxva->format).subsampling_y & 0xffff0000 | (uint)(uVar1 >> 1);
      *(uint *)&(dxva->format).subsampling_y =
           *(uint *)&(dxva->format).subsampling_y & 0xffff | (uint)(uVar2 >> 1) << 0x10;
      uVar19._0_1_ = dxva->order_hint;
      uVar19._1_1_ = dxva->order_hint_bits;
      uVar19._2_1_ = (dxva->loop_filter).filter_level[0];
      uVar19._3_1_ = (dxva->loop_filter).filter_level[1];
      uVar36 = uVar19 & 0xffff0000 | uVar26;
      dxva->order_hint = (char)uVar36;
      dxva->order_hint_bits = (char)(uVar36 >> 8);
      (dxva->loop_filter).filter_level[0] = (char)(uVar36 >> 0x10);
      (dxva->loop_filter).filter_level[1] = (char)(uVar36 >> 0x18);
      uVar20._0_1_ = dxva->order_hint;
      uVar20._1_1_ = dxva->order_hint_bits;
      uVar20._2_1_ = (dxva->loop_filter).filter_level[0];
      uVar20._3_1_ = (dxva->loop_filter).filter_level[1];
      uVar36 = uVar20 & 0xffff | uVar37 << 0x10;
      dxva->order_hint = (char)uVar36;
      dxva->order_hint_bits = (char)(uVar36 >> 8);
      (dxva->loop_filter).filter_level[0] = (char)(uVar36 >> 0x10);
      (dxva->loop_filter).filter_level[1] = (char)(uVar36 >> 0x18);
      *(uint *)&(dxva->tiles).tile_sz_mag =
           *(uint *)&(dxva->tiles).tile_sz_mag & 0xffff | RVar28 << 0x10;
      *(uint *)&(dxva->tiles).tile_sz_mag =
           *(uint *)&(dxva->tiles).tile_sz_mag & 0xffff0000 | RVar28 & 0xffff;
      if (regs[0x3c].vdpu_av1d_pp_cfg.swreg480.field_0x1 == '\0') {
        local_c4 = 0;
        MVar30 = mpp_frame_get_fmt(buffer);
        if ((MVar30 & 0xfffff) == MPP_FMT_YUV420SP) {
          local_c4 = 3;
        }
        (dxva->tiles).tile_offset_end[0x79] =
             (dxva->tiles).tile_offset_end[0x79] & 0xff83ffff | local_c4 << 0x12;
        UVar33 = mpp_buffer_get_fd_with_caller(streambuf,"vdpu_av1d_gen_regs");
        (dxva->tiles).tile_offset_end[0x7d] = UVar33;
        UVar33 = mpp_buffer_get_fd_with_caller(streambuf,"vdpu_av1d_gen_regs");
        (dxva->tiles).tile_offset_end[0x7f] = UVar33;
        mpp_dev_set_reg_offset(ctx->film_grain_mem,0x148,RVar28 * RVar29);
      }
      else {
        bVar38 = false;
        if ((((*(uint *)&dxva->field_10 >> 0x11 & 1) == 0) &&
            (bVar38 = false, (*(uint *)&dxva->field_10 >> 0xe & 1) == 0)) &&
           ((bVar38 = false, *(uint *)((dxva->tiles).widths + 0xb) >> 0x1a == 0 &&
            (bVar38 = false, *(uint *)((dxva->tiles).widths + 0xd) >> 0x1a == 0)))) {
          bVar38 = *(uint *)((dxva->tiles).widths + 0x13) >> 0x1a == 0;
        }
        local_e0 = uVar37;
        if (8 < *(ushort *)((long)mframe + 0xe)) {
          local_e0 = uVar37 << 1;
        }
        *(uint *)&(dxva->tiles).tile_sz_mag =
             *(uint *)&(dxva->tiles).tile_sz_mag & 0xffff | local_e0 << 0x10;
        local_e4 = uVar37;
        if (8 < *(ushort *)((long)mframe + 0xe)) {
          local_e4 = uVar37 << 1;
        }
        *(uint *)&(dxva->tiles).tile_sz_mag =
             *(uint *)&(dxva->tiles).tile_sz_mag & 0xffff0000 | local_e4 & 0xffff;
        *(uint *)((dxva->tiles).heights + 0x23) =
             *(uint *)((dxva->tiles).heights + 0x23) & 0xffffdfff | 0x2000;
        *(uint *)((dxva->tiles).heights + 0x23) =
             *(uint *)((dxva->tiles).heights + 0x23) & 0xffffbfff | 0x4000;
        (dxva->tiles).tile_offset_end[0x77] = (dxva->tiles).tile_offset_end[0x77] & 0xfffffff7 | 8;
        (dxva->tiles).tile_offset_end[0x78] =
             (dxva->tiles).tile_offset_end[0x78] & 0xfffff9ff | 0x400;
        if ((uVar2 & 0xf) == 0) {
          vir_bottom = 0;
        }
        else {
          vir_bottom = 0x10 - (uVar37 & 0xf);
        }
        if (bVar38) {
          bypass_filter = 0;
        }
        else {
          bypass_filter = 8;
        }
        if ((bypass_filter + uVar26 & 0xf) == 0) {
          out_w = 0;
        }
        else {
          out_w = 0x10 - (bypass_filter + uVar26 & 0xf);
        }
        uVar37._0_2_ = dxva->frame_refs[0].gamma;
        uVar37._2_2_ = dxva->frame_refs[0].delta;
        uVar37 = uVar37 & 0xfff0ffff | bypass_filter << 0x10;
        dxva->frame_refs[0].gamma = (short)uVar37;
        dxva->frame_refs[0].delta = (short)(uVar37 >> 0x10);
        uVar21._0_2_ = dxva->frame_refs[0].gamma;
        uVar21._2_2_ = dxva->frame_refs[0].delta;
        dxva->frame_refs[0].gamma = (short)(uVar21 & 0xff0fffff);
        dxva->frame_refs[0].delta = (short)((uVar21 & 0xff0fffff) >> 0x10);
        uVar22._0_2_ = dxva->frame_refs[0].gamma;
        uVar22._2_2_ = dxva->frame_refs[0].delta;
        uVar37 = uVar22 & 0xf0ffffff | (out_w & 0xf) << 0x18;
        dxva->frame_refs[0].gamma = (short)uVar37;
        dxva->frame_refs[0].delta = (short)(uVar37 >> 0x10);
        uVar23._0_2_ = dxva->frame_refs[0].gamma;
        uVar23._2_2_ = dxva->frame_refs[0].delta;
        uVar37 = uVar23 & 0xfffffff | vir_bottom << 0x1c;
        dxva->frame_refs[0].gamma = (short)uVar37;
        dxva->frame_refs[0].delta = (short)(uVar37 >> 0x10);
        mpp_frame_set_offset_y(buffer,bypass_filter);
        mpp_frame_set_ver_stride(buffer,bypass_filter + uVar26 + out_w);
        (dxva->tiles).tile_offset_end[0x79] = (dxva->tiles).tile_offset_end[0x79] & 0xff83ffff;
        UVar33 = mpp_buffer_get_fd_with_caller(streambuf,"vdpu_av1d_gen_regs");
        (dxva->tiles).tile_offset_end[0x7d] = UVar33;
        UVar33 = mpp_buffer_get_fd_with_caller(streambuf,"vdpu_av1d_gen_regs");
        (dxva->tiles).tile_offset_end[0x7f] = UVar33;
        UVar33 = mpp_buffer_get_fd_with_caller(streambuf,"vdpu_av1d_gen_regs");
        dxva->frame_refs[1].height = UVar33;
      }
    }
    else {
      _mpp_log_l(2,"hal_av1d_vdpu","parse err %d ref err %d\n","vdpu_av1d_gen_regs",
                 (ulong)((uint)((task->dec).flags.val >> 2) & 1),
                 (ulong)((uint)((task->dec).flags.val >> 3) & 1));
    }
  }
  return MPP_OK;
}

Assistant:

MPP_RET vdpu_av1d_gen_regs(void *hal, HalTaskInfo *task)
{
    MPP_RET ret = MPP_ERR_UNKNOW;
    Av1dHalCtx *p_hal = (Av1dHalCtx *)hal;
    VdpuAv1dRegCtx *ctx = (VdpuAv1dRegCtx *)p_hal->reg_ctx;
    VdpuAv1dRegSet *regs;
    DXVA_PicParams_AV1 *dxva = (DXVA_PicParams_AV1*)task->dec.syntax.data;
    MppFrame mframe;
    MppBuffer buffer = NULL;
    MppBuffer streambuf = NULL;
    RK_U32 height = dxva->height;
    RK_U32 width = dxva->width;
    RK_U32 hor_stride;
    RK_U32 ver_stride;
    HalBuf *tile_out_buf;
    RK_U32 num_tile_cols = 1 << dxva->tile_cols_log2;

    INP_CHECK(ret, NULL == p_hal);

    ctx->refresh_frame_flags = dxva->refresh_frame_flags;

    if (task->dec.flags.parse_err ||
        task->dec.flags.ref_err) {
        mpp_err_f("parse err %d ref err %d\n",
                  task->dec.flags.parse_err, task->dec.flags.ref_err);
        goto __RETURN;
    }

    if (p_hal->fast_mode) {
        RK_U32 i = 0;

        for (i = 0; i <  MPP_ARRAY_ELEMS(ctx->reg_buf); i++) {
            if (!ctx->reg_buf[i].valid) {
                task->dec.reg_index = i;
                ctx->regs = ctx->reg_buf[i].regs;
                ctx->reg_buf[i].valid = 1;
                break;
            }
        }
    }

    regs = ctx->regs;
    memset(regs, 0, sizeof(*regs));

    vdpu_av1d_setup_tile_bufs(p_hal, dxva);

    if (!ctx->filter_mem || height > ctx->height || num_tile_cols > ctx->num_tile_cols) {
        if (ctx->filter_mem)
            vdpu_av1d_filtermem_release(ctx);
        ret = vdpu_av1d_filtermem_alloc(p_hal, ctx, dxva);
        if (!ret) {
            mpp_err("filt buffer get fail\n");
            vdpu_av1d_filtermem_release(ctx);
        }
    }

    ctx->width = width;
    ctx->height = height;
    ctx->num_tile_cols = num_tile_cols;
    mpp_buf_slot_get_prop(p_hal->slots, task->dec.output, SLOT_FRAME_PTR, &mframe);
    mpp_buf_slot_get_prop(p_hal ->slots, task->dec.output, SLOT_BUFFER, &buffer);
    mpp_buf_slot_get_prop(p_hal ->packet_slots, task->dec.input, SLOT_BUFFER, &streambuf);
    tile_out_buf = hal_bufs_get_buf(ctx->tile_out_bufs, task->dec.output);
    hor_stride = mpp_frame_get_hor_stride(mframe);
    ver_stride = mpp_frame_get_ver_stride(mframe);

    ctx->ver_stride = ver_stride;

    p_hal->strm_len = (RK_S32)mpp_packet_get_length(task->dec.input_packet);

    ctx->fbc_en = !!MPP_FRAME_FMT_IS_FBC(mpp_frame_get_fmt(mframe));

    AV1D_DBG(AV1D_DBG_LOG, "bitdepth %d fmt %d [%d : %d] wxh [%d : %d] uxv [%d : %d]\n",
             dxva->bitdepth, mpp_frame_get_fmt(mframe),
             dxva->format.subsampling_x, dxva->format.subsampling_y,
             ctx->width, ctx->height,
             ctx->hor_stride, ctx->ver_stride);

    regs->swreg1.sw_dec_abort_e     = 0;
    regs->swreg1.sw_dec_e           = 1;
    regs->swreg1.sw_dec_tile_int_e  = 0;
    regs->swreg2.sw_dec_clk_gate_e = 1;

    regs->swreg3.sw_dec_mode           = 17; // av1 mode
    regs->swreg3.sw_skip_mode          = dxva->coding.skip_mode;
    regs->swreg3.sw_dec_out_ec_byte_word = 0; // word align
    regs->swreg3.sw_write_mvs_e        = 1;
    regs->swreg3.sw_dec_out_ec_bypass  = 1;

    regs->swreg5.sw_tempor_mvp_e        = dxva->coding.use_ref_frame_mvs;
    regs->swreg5.sw_delta_lf_res_log    = dxva->loop_filter.delta_lf_res;
    regs->swreg5.sw_delta_lf_multi      = dxva->loop_filter.delta_lf_multi;
    regs->swreg5.sw_delta_lf_present    = dxva->loop_filter.delta_lf_present;
    regs->swreg5.sw_disable_cdf_update  = dxva->coding.disable_cdf_update;
    regs->swreg5.sw_allow_warp          = dxva->coding.warped_motion;
    regs->swreg5.sw_show_frame          = dxva->format.show_frame;
    regs->swreg5.sw_switchable_motion_mode  = dxva->coding.switchable_motion_mode;
    regs->swreg5.sw_enable_cdef         = !(dxva->cdef.bits == 0 && dxva->cdef.damping == 0 &&
                                            dxva->cdef.y_strengths[0].primary == 0 &&
                                            dxva->cdef.y_strengths[0].secondary == 0 &&
                                            dxva->cdef.uv_strengths[0].primary == 0 &&
                                            dxva->cdef.uv_strengths[0].secondary == 0);
    regs->swreg5.sw_allow_masked_compound   = dxva->coding.masked_compound;
    regs->swreg5.sw_allow_interintra    = dxva->coding.interintra_compound;
    regs->swreg5.sw_enable_intra_edge_filter = dxva->coding.intra_edge_filter;
    regs->swreg5.sw_allow_filter_intra  = dxva->coding.filter_intra;
    regs->swreg5.sw_enable_jnt_comp     = dxva->coding.jnt_comp;
    regs->swreg5.sw_enable_dual_filter  = dxva->coding.dual_filter;
    regs->swreg5.sw_reduced_tx_set_used = dxva->coding.reduced_tx_set;
    regs->swreg5.sw_allow_screen_content_tools = dxva->coding.screen_content_tools;
    regs->swreg5.sw_allow_intrabc       = dxva->coding.intrabc;

    regs->swreg5.sw_force_interger_mv   = dxva->coding.integer_mv;

    vdpu_av1d_set_global_model(p_hal, dxva);
    vdpu_av1d_set_tile_info_mem(p_hal, dxva);

    if ((dxva->format.frame_type && (dxva->format.frame_type != AV1_FRAME_INTRA_ONLY))
        || dxva->coding.intrabc) {
        vdpu_av1d_set_reference_frames(p_hal, ctx, dxva);
    }
    vdpu_av1d_set_segmentation(ctx, dxva);
    vdpu_av1d_set_loopfilter(p_hal, dxva);
    vdpu_av1d_set_picture_dimensions(p_hal, dxva);
    vdpu_av1d_set_cdef(p_hal, dxva);
    vdpu_av1d_set_lr(p_hal, dxva);
    vdpu_av1d_set_fgs(ctx, dxva);
    vdpu_av1d_set_prob(p_hal, dxva);
    vdpu_av1d_set_tile_info_regs(ctx, dxva);

#if DUMP_AV1_DATAS/* dump buffer */
    {
        char name[128];
        char *path = "/data/video";
        static int g_frame_num = 0;
        FILE *fp;
        RK_U32 i;
        RK_U32 *data;
        RK_U32 size;

        data = mpp_buffer_get_ptr(ctx->global_model);
        size = MPP_ALIGN(GLOBAL_MODEL_SIZE, 2048);
        memset(name, 0, sizeof(name));
        sprintf(name, "%s/global_mode_%d.txt", path, g_frame_num);
        fp = fopen(name, "wb");
        for ( i = 0; i < size / 4; i++)
            fprintf(fp, "%08x\n", data[i]);
        fflush(fp);
        fclose(fp);

        data = mpp_buffer_get_ptr(ctx->tile_info);
        size = AV1_TILE_INFO_SIZE;
        memset(name, 0, sizeof(name));
        sprintf(name, "%s/tile_info_%d.txt", path, g_frame_num);
        fp = fopen(name, "wb");
        for ( i = 0; i < size / 4; i++)
            fprintf(fp, "%08x\n", data[i]);
        fflush(fp);
        fclose(fp);

        data = mpp_buffer_get_ptr(streambuf);
        size = MPP_ALIGN(p_hal->strm_len, 1);
        memset(name, 0, sizeof(name));
        sprintf(name, "%s/stream_%d.txt", path, g_frame_num);
        fp = fopen(name, "wb");
        fwrite((RK_U8*)data, 1, size, fp);
        fflush(fp);
        fclose(fp);

        data = mpp_buffer_get_ptr(ctx->film_grain_mem);
        size = MPP_ALIGN(sizeof(AV1FilmGrainMemory), 2048);
        memset(name, 0, sizeof(name));
        sprintf(name, "%s/film_grain_mem_%d.txt", path, g_frame_num);
        fp = fopen(name, "wb");
        for ( i = 0; i < size / 4; i++)
            fprintf(fp, "%08x\n", data[i]);
        fflush(fp);
        fclose(fp);

        data = mpp_buffer_get_ptr(ctx->prob_tbl_base);
        size = MPP_ALIGN(sizeof(AV1CDFs), 2048);
        memset(name, 0, sizeof(name));
        sprintf(name, "%s/prob_tbl_%d.txt", path, g_frame_num);
        fp = fopen(name, "wb");
        for ( i = 0; i < size / 4; i++)
            fprintf(fp, "%08x\n", data[i]);
        fflush(fp);
        fclose(fp);

        data = mpp_buffer_get_ptr(ctx->prob_tbl_out_base);
        size = MPP_ALIGN(sizeof(AV1CDFs), 2048);
        memset(name, 0, sizeof(name));
        sprintf(name, "%s/prob_tbl_out_%d.txt", path, g_frame_num);
        fp = fopen(name, "wb");
        for ( i = 0; i < size / 4; i++)
            fprintf(fp, "%08x\n", data[i]);
        fflush(fp);
        fclose(fp);

        g_frame_num ++;
    }
#endif

    regs->swreg7.sw_blackwhite_e    = dxva->format.mono_chrome;
    regs->swreg7.sw_clip_to_restricted_range  = dxva->film_grain.clip_to_restricted_range;
    regs->swreg7.sw_delta_q_res_log     = dxva->quantization.delta_q_res;
    regs->swreg7.sw_delta_q_present     = dxva->quantization.delta_q_present;

    regs->swreg8.sw_idr_pic_e           = !dxva->format.frame_type;
    regs->swreg8.sw_quant_base_qindex   = dxva->quantization.base_qindex;
    regs->swreg8.sw_bit_depth_y_minus8  = dxva->bitdepth - 8;
    regs->swreg8.sw_bit_depth_c_minus8  = dxva->bitdepth - 8;

    regs->swreg11.sw_mcomp_filt_type    = dxva->interp_filter;
    regs->swreg11.sw_high_prec_mv_e     = dxva->coding.high_precision_mv;
    regs->swreg11.sw_comp_pred_mode     = dxva->coding.reference_mode ? 2 : 0;
    regs->swreg11.sw_transform_mode     = dxva->coding.tx_mode ? (dxva->coding.tx_mode + 2) : 0;
    regs->swreg12.sw_max_cb_size        = dxva->coding.use_128x128_superblock ? 7 : 6;;
    regs->swreg12.sw_min_cb_size        = 3;

    /* unused in comdel */
    regs->swreg12.sw_av1_comp_pred_fixed_ref    = 0;
    regs->swreg13.sw_comp_pred_var_ref0_av1     = 0;
    regs->swreg13.sw_comp_pred_var_ref1_av1     = 0;
    regs->swreg14.sw_filt_level_seg0            = 0;
    regs->swreg15.sw_filt_level_seg1            = 0;
    regs->swreg16.sw_filt_level_seg2            = 0;
    regs->swreg17.sw_filt_level_seg3            = 0;
    regs->swreg18.sw_filt_level_seg4            = 0;
    regs->swreg19.sw_filt_level_seg5            = 0;
    regs->swreg31.sw_filt_level_seg6            = 0;
    regs->swreg32.sw_filt_level_seg7            = 0;


    regs->swreg13.sw_qp_delta_y_dc_av1          = dxva->quantization.y_dc_delta_q;
    regs->swreg13.sw_qp_delta_ch_dc_av1         = dxva->quantization.u_dc_delta_q;
    regs->swreg13.sw_qp_delta_ch_ac_av1         = dxva->quantization.u_ac_delta_q;
    regs->swreg47.sw_qmlevel_y                  = dxva->quantization.qm_y;
    regs->swreg48.sw_qmlevel_u                  = dxva->quantization.qm_u;
    regs->swreg49.sw_qmlevel_v                  = dxva->quantization.qm_v;

    regs->swreg13.sw_lossless_e                 = dxva->coded_lossless;
    regs->swreg28.sw_quant_delta_v_dc           = dxva->quantization.v_dc_delta_q;
    regs->swreg29.sw_quant_delta_v_ac           = dxva->quantization.v_ac_delta_q;

    regs->swreg31.sw_skip_ref0              = dxva->skip_ref0 ? dxva->skip_ref0 : 1;
    regs->swreg32.sw_skip_ref1              = dxva->skip_ref1 ? dxva->skip_ref1 : 1;

    /*input out put buf cfg*/
    {
        // RK_U32 out_w = MPP_ALIGN(4 * width * bit_depth, 128) / 8;
        // RK_U32 out_h = height / 4;
        // RK_U32 y_stride = out_w * out_h;
        // RK_U32 uv_stride = y_stride / 2;

        RK_U32 y_stride = ctx->luma_size;
        RK_U32 uv_stride = y_stride / 2;
        RK_U32 mv_offset = y_stride + uv_stride + 64;
        RK_U32 offset = (dxva->frame_tag_size & (~0xf));

        regs->addr_cfg.swreg65.sw_dec_out_ybase_lsb = mpp_buffer_get_fd(tile_out_buf->buf[0]);//mpp_buffer_get_fd(buffer);
        regs->addr_cfg.swreg99.sw_dec_out_cbase_lsb = mpp_buffer_get_fd(tile_out_buf->buf[0]);
        mpp_dev_set_reg_offset(p_hal->dev, 99, y_stride);
        regs->addr_cfg.swreg133.sw_dec_out_dbase_lsb = mpp_buffer_get_fd(tile_out_buf->buf[0]);
        mpp_dev_set_reg_offset(p_hal->dev, 133, mv_offset);

        /*  if (ctx->fbc_en) {
              regs->swreg190.sw_dec_out_tybase_lsb = 0;// TODO:
              regs->swreg224.sw_dec_out_tcbase_lsb = 0;// TODO:
          }*/

        regs->swreg258.sw_strm_buffer_len = MPP_ALIGN(p_hal->strm_len, 128);//
        regs->swreg5.sw_strm_start_bit    =  (dxva->frame_tag_size & 0xf) * 8; // bit start to decode
        regs->swreg6.sw_stream_len  = MPP_ALIGN(p_hal->strm_len, 128);//p_hal->strm_len - offset;
        regs->swreg259.sw_strm_start_offset = 0;
        regs->addr_cfg.swreg168.sw_stream_base_msb = 0;
        regs->addr_cfg.swreg169.sw_stream_base_lsb = mpp_buffer_get_fd(streambuf);
        mpp_dev_set_reg_offset(p_hal->dev, 169, offset);

        AV1D_DBG(AV1D_DBG_LOG, "stream len %d\n", p_hal->strm_len);
        AV1D_DBG(AV1D_DBG_LOG, "stream offset %d\n", offset);
        AV1D_DBG(AV1D_DBG_LOG, "stream tag_size %d\n", dxva->frame_tag_size);
        AV1D_DBG(AV1D_DBG_LOG, "stream start_bit %d\n", regs->swreg5.sw_strm_start_bit);
    }
    regs->swreg314.sw_dec_alignment = 64;

    regs->addr_cfg.swreg175.sw_mc_sync_curr_base_lsb = mpp_buffer_get_fd(ctx->tile_buf);
    regs->addr_cfg.swreg177.sw_mc_sync_left_base_lsb = mpp_buffer_get_fd(ctx->tile_buf);

    regs->swreg55.sw_apf_disable = 0;
    regs->swreg55.sw_apf_threshold = 8;
    regs->swreg58.sw_dec_buswidth = 2;
    regs->swreg58.sw_dec_max_burst = 16;
    regs->swreg266.sw_error_conceal_e                     = 0;
    regs->swreg265.sw_axi_rd_ostd_threshold               = 64;
    regs->swreg265.sw_axi_wr_ostd_threshold               = 64;

    regs->swreg318.sw_ext_timeout_cycles                  = 0xfffffff;
    regs->swreg318.sw_ext_timeout_override_e              = 1;
    regs->swreg319.sw_timeout_cycles                      = 0xfffffff;
    regs->swreg319.sw_timeout_override_e                  = 1;

    /* pp cfg */
    regs->vdpu_av1d_pp_cfg.swreg320.sw_pp_out_e = 1;
    regs->vdpu_av1d_pp_cfg.swreg322.sw_pp_in_format = 0;
    regs->vdpu_av1d_pp_cfg.swreg394.sw_pp0_dup_hor = 1;
    regs->vdpu_av1d_pp_cfg.swreg394.sw_pp0_dup_ver = 1;
    regs->vdpu_av1d_pp_cfg.swreg331.sw_pp_in_height = height / 2;
    regs->vdpu_av1d_pp_cfg.swreg331.sw_pp_in_width = width / 2;
    regs->vdpu_av1d_pp_cfg.swreg332.sw_pp_out_height = height;
    regs->vdpu_av1d_pp_cfg.swreg332.sw_pp_out_width = width;
    regs->vdpu_av1d_pp_cfg.swreg329.sw_pp_out_y_stride = hor_stride;
    regs->vdpu_av1d_pp_cfg.swreg329.sw_pp_out_c_stride = hor_stride;

    // regs->vdpu_av1d_pp_cfg.swreg337.sw_pp_in_y_stride = hor_stride;
    // regs->vdpu_av1d_pp_cfg.swreg337.sw_pp_in_c_stride = hor_stride;
    if (ctx->fbc_en) {
        RK_U32 vir_left = 0, vir_right = 0, vir_top = 0, vir_bottom = 0;
        RK_U32 bypass_filter = !regs->swreg5.sw_superres_is_scaled &&
                               !regs->swreg5.sw_enable_cdef &&
                               !regs->swreg14.sw_filt_level0 &&
                               !regs->swreg15.sw_filt_level1 &&
                               !regs->swreg18.sw_lr_type;

        regs->vdpu_av1d_pp_cfg.swreg329.sw_pp_out_y_stride = dxva->bitdepth > 8 ?
                                                             width * 2 : width;
        regs->vdpu_av1d_pp_cfg.swreg329.sw_pp_out_c_stride = dxva->bitdepth > 8 ?
                                                             width * 2 : width;
        regs->swreg58.sw_dec_axi_wd_id_e = 1;
        regs->swreg58.sw_dec_axi_rd_id_e = 1;
        regs->vdpu_av1d_pp_cfg.swreg320.sw_pp_out_tile_e = 1;
        regs->vdpu_av1d_pp_cfg.swreg321.sw_pp_tile_size = 2;

        vir_left = 0;
        if (((vir_left + width) % 16))
            vir_right = 16 - ((vir_left + width) % 16);
        else
            vir_right = 0;

        if (!bypass_filter)
            vir_top = 8;
        else
            vir_top = 0;

        if (((vir_top + height) % 16))
            vir_bottom = 16 - ((vir_top + height) % 16);
        else
            vir_bottom = 0;

        regs->vdpu_av1d_pp_cfg.swreg503.sw_pp0_virtual_top = vir_top;
        regs->vdpu_av1d_pp_cfg.swreg503.sw_pp0_virtual_left = vir_left;
        regs->vdpu_av1d_pp_cfg.swreg503.sw_pp0_virtual_bottom = vir_bottom;
        regs->vdpu_av1d_pp_cfg.swreg503.sw_pp0_virtual_right = vir_right;
        mpp_frame_set_offset_y(mframe, vir_top);
        mpp_frame_set_ver_stride(mframe, vir_top + height + vir_bottom);
        regs->vdpu_av1d_pp_cfg.swreg322.sw_pp_out_format = 0;
        regs->vdpu_av1d_pp_cfg.swreg326.sw_pp_out_lu_base_lsb = mpp_buffer_get_fd(buffer);
        regs->vdpu_av1d_pp_cfg.swreg328.sw_pp_out_ch_base_lsb = mpp_buffer_get_fd(buffer);
        regs->vdpu_av1d_pp_cfg.swreg505.sw_pp0_afbc_tile_base_lsb = mpp_buffer_get_fd(buffer);
    } else {
        RK_U32 out_w = hor_stride;
        RK_U32 out_h = ver_stride;
        RK_U32 y_stride = out_w * out_h;
        RK_U32 out_fmt = 0;

        if ((mpp_frame_get_fmt(mframe) & MPP_FRAME_FMT_MASK) == MPP_FMT_YUV420SP)
            out_fmt = 3;

        /*
         * out_fmt:
         * 0 is 8bit or 10bit output by syntax
         * 3 is force 8bit output
         */
        regs->vdpu_av1d_pp_cfg.swreg322.sw_pp_out_format = out_fmt;
        regs->vdpu_av1d_pp_cfg.swreg326.sw_pp_out_lu_base_lsb = mpp_buffer_get_fd(buffer);
        regs->vdpu_av1d_pp_cfg.swreg328.sw_pp_out_ch_base_lsb = mpp_buffer_get_fd(buffer);
        mpp_dev_set_reg_offset(p_hal->dev, 328, y_stride);
    }

__RETURN:
    return ret = MPP_OK;
}